

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O3

void __thiscall QGroupBox::mousePressEvent(QGroupBox *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  QRect QVar3;
  uint uVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  double dVar6;
  undefined1 auVar7 [16];
  QStyleOptionGroupBox box;
  QRect local_c8;
  QStyleOptionGroupBox local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(event + 0x40) == 1) {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    memset(&local_b8,0xaa,0x88);
    QStyleOptionGroupBox::QStyleOptionGroupBox(&local_b8);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&local_b8);
    pQVar5 = QWidget::style(&this->super_QWidget);
    auVar7 = QEventPoint::position();
    dVar6 = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_;
    bVar2 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    local_c8.x1.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar6);
    dVar6 = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_;
    bVar2 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    local_c8.y1.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar6);
    uVar4 = (**(code **)(*(long *)pQVar5 + 0xd0))(pQVar5,7,&local_b8,&local_c8,this);
    QVar3.x2.m_i = local_c8.x2.m_i;
    QVar3.y2.m_i = local_c8.y2.m_i;
    QVar3.x1.m_i = local_c8.x1.m_i;
    QVar3.y1.m_i = local_c8.y1.m_i;
    *(uint *)(lVar1 + 0x280) = uVar4;
    if (((uVar4 & 3) == 0) || (*(char *)(lVar1 + 0x279) == '\0')) {
      event[0xc] = (QMouseEvent)0x0;
    }
    else {
      *(undefined1 *)(lVar1 + 0x27c) = 1;
      pQVar5 = QWidget::style(&this->super_QWidget);
      local_c8 = (QRect)(**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,7,&local_b8,1,this);
      QWidget::update(&this->super_QWidget,&local_c8);
      QVar3 = local_c8;
    }
    local_c8 = QVar3;
    if (&(local_b8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_b8.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  }
  else {
    event[0xc] = (QMouseEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    Q_D(QGroupBox);
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    d->pressedControl = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                       event->position().toPoint(), this);
    if (d->checkable && (d->pressedControl & (QStyle::SC_GroupBoxCheckBox | QStyle::SC_GroupBoxLabel))) {
        d->overCheckBox = true;
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
    } else {
        event->ignore();
    }
}